

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_class.c
# Opt level: O0

void small_class_create(small_class *sc,uint granularity,float desired_factor,uint min_alloc,
                       float *actual_factor)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float log2;
  float *actual_factor_local;
  uint min_alloc_local;
  float desired_factor_local;
  uint granularity_local;
  small_class *sc_local;
  
  if (granularity == 0) {
    __assert_fail("granularity > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small_class.c"
                  ,0x29,
                  "void small_class_create(struct small_class *, unsigned int, float, unsigned int, float *)"
                 );
  }
  if ((granularity & granularity - 1) != 0) {
    __assert_fail("(granularity & (granularity - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small_class.c"
                  ,0x2a,
                  "void small_class_create(struct small_class *, unsigned int, float, unsigned int, float *)"
                 );
  }
  if (desired_factor <= 1.0) {
    __assert_fail("desired_factor > 1.f",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small_class.c"
                  ,0x2b,
                  "void small_class_create(struct small_class *, unsigned int, float, unsigned int, float *)"
                 );
  }
  if (desired_factor <= 2.0) {
    if (min_alloc == 0) {
      __assert_fail("min_alloc > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small_class.c"
                    ,0x2d,
                    "void small_class_create(struct small_class *, unsigned int, float, unsigned int, float *)"
                   );
    }
    if (actual_factor != (float *)0x0) {
      sc->granularity = granularity;
      uVar1 = 0;
      for (uVar2 = granularity; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
        uVar1 = uVar1 + 1;
      }
      sc->ignore_bits_count = uVar1;
      fVar3 = logf(2.0);
      fVar4 = logf(desired_factor);
      fVar4 = logf(fVar3 / fVar4);
      sc->effective_bits = (uint)(long)(fVar4 / fVar3 + 0.5);
      sc->effective_size = 1 << ((byte)sc->effective_bits & 0x1f);
      sc->effective_mask = sc->effective_size - 1;
      sc->size_shift = min_alloc - granularity;
      sc->size_shift_plus_1 = sc->size_shift + 1;
      fVar3 = powf(2.0,(float)sc->effective_bits);
      fVar3 = powf(2.0,1.0 / fVar3);
      sc->actual_factor = fVar3;
      *actual_factor = sc->actual_factor;
      return;
    }
    __assert_fail("actual_factor != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small_class.c"
                  ,0x2e,
                  "void small_class_create(struct small_class *, unsigned int, float, unsigned int, float *)"
                 );
  }
  __assert_fail("desired_factor <= 2.f",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small_class.c"
                ,0x2c,
                "void small_class_create(struct small_class *, unsigned int, float, unsigned int, float *)"
               );
}

Assistant:

void
small_class_create(struct small_class *sc, unsigned granularity,
		   float desired_factor, unsigned min_alloc, float *actual_factor)
{
	assert(granularity > 0); /* size cannot be multiple of zero. */
	assert((granularity & (granularity - 1)) == 0); /* must power of 2. */
	assert(desired_factor > 1.f);
	assert(desired_factor <= 2.f);
	assert(min_alloc > 0); /* Cannot allocate zero. */
	assert(actual_factor != NULL);

	sc->granularity = granularity;
	sc->ignore_bits_count = __builtin_ctz(granularity);
	float log2 = logf(2);
	sc->effective_bits = (unsigned)(logf(log2 / logf(desired_factor)) / log2 + .5);
	sc->effective_size = 1u << sc->effective_bits;
	sc->effective_mask = sc->effective_size - 1u;
	sc->size_shift = min_alloc - granularity;
	sc->size_shift_plus_1 = sc->size_shift + 1;

	sc->actual_factor = powf(2, 1.f / powf(2, sc->effective_bits));
	*actual_factor = sc->actual_factor;
}